

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_read_augment(lys_module *module,lys_node *parent,lys_node_augment *aug,char *value)

{
  char *pcVar1;
  bool bVar2;
  
  aug->nodetype = LYS_AUGMENT;
  pcVar1 = transform_schema2json(module,value);
  aug->target_name = pcVar1;
  free(value);
  bVar2 = aug->target_name == (char *)0x0;
  if (!bVar2) {
    aug->parent = parent;
    aug->module = module;
  }
  return (uint)bVar2;
}

Assistant:

int
yang_read_augment(struct lys_module *module, struct lys_node *parent, struct lys_node_augment *aug, char *value)
{
    aug->nodetype = LYS_AUGMENT;
    aug->target_name = transform_schema2json(module, value);
    free(value);
    if (!aug->target_name) {
        return EXIT_FAILURE;
    }
    aug->parent = parent;
    aug->module = module;
    return EXIT_SUCCESS;
}